

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

Psbt * __thiscall cfd::core::Psbt::operator=(Psbt *this,Psbt *psbt)

{
  CfdException *this_00;
  void *wally_psbt_pointer;
  allocator local_65;
  int ret;
  wally_psbt *psbt_pointer;
  Transaction local_58;
  
  if (this != psbt) {
    psbt_pointer = (wally_psbt *)0x0;
    wally_psbt_pointer = (void *)0x0;
    ret = wally_psbt_clone_alloc((wally_psbt *)psbt->wally_psbt_pointer_,0,&psbt_pointer);
    if (ret != 0) {
      local_58.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4b240b;
      local_58.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x778;
      local_58.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x4b2e60;
      logger::warn<int&>((CfdSourceLocation *)&local_58,"wally_psbt_clone_alloc NG[{}]",&ret);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&local_58,"psbt clone error.",&local_65);
      CfdException::CfdException(this_00,kCfdInternalError,(string *)&local_58);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    FreeWallyPsbtAddress((Psbt *)this->wally_psbt_pointer_,wally_psbt_pointer);
    this->wally_psbt_pointer_ = psbt_pointer;
    RebuildTransaction(&local_58,psbt_pointer);
    Transaction::operator=(&this->base_tx_,&local_58);
    Transaction::~Transaction(&local_58);
  }
  return this;
}

Assistant:

Psbt &Psbt::operator=(const Psbt &psbt) & {
  if (this != &psbt) {
    struct wally_psbt *psbt_pointer = nullptr;
    struct wally_psbt *psbt_src_pointer = nullptr;
    psbt_src_pointer =
        static_cast<struct wally_psbt *>(psbt.wally_psbt_pointer_);
    int ret = wally_psbt_clone_alloc(psbt_src_pointer, 0, &psbt_pointer);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_clone_alloc NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt clone error.");
    }
    FreeWallyPsbtAddress(wally_psbt_pointer_);  // free
    wally_psbt_pointer_ = psbt_pointer;
    base_tx_ = RebuildTransaction(wally_psbt_pointer_);
  }
  return *this;
}